

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascOpenStorage.cpp
# Opt level: O1

TCascStorage * FreeCascStorage(TCascStorage *hs)

{
  LPBYTE pBVar1;
  void *pvVar2;
  TCascStorage *in_RAX;
  TCascStorage *extraout_RAX;
  long lVar3;
  
  if (hs != (TCascStorage *)0x0) {
    if (hs->pEncryptionKeys != (PCASC_MAP)0x0) {
      Map_Free(hs->pEncryptionKeys);
    }
    pBVar1 = (hs->ExtraKeysList).m_pItemArray;
    if (pBVar1 != (LPBYTE)0x0) {
      free(pBVar1);
    }
    (hs->ExtraKeysList).m_pItemArray = (LPBYTE)0x0;
    (hs->ExtraKeysList).m_ItemCountMax = 0;
    (hs->ExtraKeysList).m_ItemCount = 0;
    if (hs->pRootHandler != (TRootHandler *)0x0) {
      (*hs->pRootHandler->_vptr_TRootHandler[1])();
    }
    hs->pRootHandler = (TRootHandler *)0x0;
    pBVar1 = (hs->VfsRootList).m_pItemArray;
    if (pBVar1 != (LPBYTE)0x0) {
      free(pBVar1);
    }
    (hs->VfsRootList).m_pItemArray = (LPBYTE)0x0;
    (hs->VfsRootList).m_ItemCountMax = 0;
    (hs->VfsRootList).m_ItemCount = 0;
    if (hs->pCKeyEntryMap != (PCASC_MAP)0x0) {
      Map_Free(hs->pCKeyEntryMap);
    }
    if (hs->pEKeyEntryMap != (PCASC_MAP)0x0) {
      Map_Free(hs->pEKeyEntryMap);
    }
    pBVar1 = (hs->EncodingData).pbData;
    if (pBVar1 != (LPBYTE)0x0) {
      free(pBVar1);
    }
    lVar3 = 0x38;
    do {
      if ((TFileStream *)(&hs->szClassName)[lVar3] != (TFileStream *)0x0) {
        FileStream_Close((TFileStream *)(&hs->szClassName)[lVar3]);
        (&hs->szClassName)[lVar3] = (char *)0x0;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x138);
    lVar3 = 0x9e8;
    do {
      pvVar2 = *(void **)((long)hs + lVar3 + -0x28);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
      }
      pvVar2 = *(void **)((long)hs + lVar3 + -0x20);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
      }
      pvVar2 = *(void **)((long)&hs->szClassName + lVar3);
      if ((pvVar2 != (void *)0x0) && (*(char *)((long)hs + lVar3 + -0xf) == '\x01')) {
        free(pvVar2);
      }
      *(undefined8 *)((long)&hs->szClassName + lVar3) = 0;
      lVar3 = lVar3 + 0x38;
    } while (lVar3 != 0xd68);
    if (hs->szDataPath != (TCHAR *)0x0) {
      free(hs->szDataPath);
    }
    if (hs->szBuildFile != (TCHAR *)0x0) {
      free(hs->szBuildFile);
    }
    if (hs->szIndexPath != (TCHAR *)0x0) {
      free(hs->szIndexPath);
    }
    if (hs->szCdnList != (TCHAR *)0x0) {
      free(hs->szCdnList);
    }
    FreeCascBlob(&hs->CdnConfigKey);
    FreeCascBlob(&hs->CdnBuildKey);
    FreeCascBlob(&hs->ArchiveGroup);
    FreeCascBlob(&hs->ArchivesKey);
    FreeCascBlob(&hs->PatchArchivesKey);
    FreeCascBlob(&hs->PatchArchivesGroup);
    FreeCascBlob(&hs->BuildFiles);
    hs->szClassName = (char *)0x0;
    free(hs);
    return extraout_RAX;
  }
  return in_RAX;
}

Assistant:

static TCascStorage * FreeCascStorage(TCascStorage * hs)
{
    size_t i;

    if(hs != NULL)
    {
        // Free the keys array
        if(hs->pEncryptionKeys != NULL)
            Map_Free(hs->pEncryptionKeys);
        hs->ExtraKeysList.Free();

        // Free the root handler
        if(hs->pRootHandler != NULL)
            delete hs->pRootHandler;
        hs->pRootHandler = NULL;

        // Free the VFS root list
        hs->VfsRootList.Free();

        // Free the pointers to file entries
        if(hs->pCKeyEntryMap != NULL)
            Map_Free(hs->pCKeyEntryMap);
        if(hs->pEKeyEntryMap != NULL)
            Map_Free(hs->pEKeyEntryMap);
        if(hs->EncodingData.pbData != NULL)
            CASC_FREE(hs->EncodingData.pbData);

        // Close all data files
        for(i = 0; i < CASC_MAX_DATA_FILES; i++)
        {
            if(hs->DataFiles[i] != NULL)
            {
                FileStream_Close(hs->DataFiles[i]);
                hs->DataFiles[i] = NULL;
            }
        }

        // Close all key mappings
        for(i = 0; i < CASC_INDEX_COUNT; i++)
        {
            if(hs->IndexFile[i].szFileName != NULL)
                CASC_FREE(hs->IndexFile[i].szFileName);
            if(hs->IndexFile[i].pbFileData != NULL)
                CASC_FREE(hs->IndexFile[i].pbFileData);
            if(hs->IndexFile[i].pEKeyEntries && hs->IndexFile[i].FreeEKeyEntries)
                CASC_FREE(hs->IndexFile[i].pEKeyEntries);
            hs->IndexFile[i].pEKeyEntries = NULL;
        }

        // Free the file paths
        if(hs->szDataPath != NULL)
            CASC_FREE(hs->szDataPath);
        if(hs->szBuildFile != NULL)
            CASC_FREE(hs->szBuildFile);
        if(hs->szIndexPath != NULL)
            CASC_FREE(hs->szIndexPath);
        if(hs->szCdnList != NULL)
            CASC_FREE(hs->szCdnList);

        // Free the blobs
        FreeCascBlob(&hs->CdnConfigKey);
        FreeCascBlob(&hs->CdnBuildKey);
        
        FreeCascBlob(&hs->ArchiveGroup);
        FreeCascBlob(&hs->ArchivesKey);
        FreeCascBlob(&hs->PatchArchivesKey);
        FreeCascBlob(&hs->PatchArchivesGroup);
        FreeCascBlob(&hs->BuildFiles);

        // Free the storage structure
        hs->szClassName = NULL;
        CASC_FREE(hs);
    }

    return NULL;
}